

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Normal3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Normal3f *n,Float time)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Normal3f NVar16;
  Transform t;
  Transform local_90;
  
  if ((this->actuallyAnimated != true) || (time <= this->startTime)) {
    fVar7 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
    uVar2 = *(undefined8 *)(this->startTransform).mInv.m[1];
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).x;
    auVar13._4_4_ = fVar1;
    auVar13._0_4_ = fVar1;
    auVar13._8_4_ = fVar1;
    auVar13._12_4_ = fVar1;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(this->startTransform).mInv.m[0];
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    auVar5._0_4_ = fVar7 * (float)uVar2;
    auVar5._4_4_ = fVar7 * (float)((ulong)uVar2 >> 0x20);
    auVar5._8_4_ = fVar7 * 0.0;
    auVar5._12_4_ = fVar7 * 0.0;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->startTransform).mInv.m[1][2])),auVar13,
                             ZEXT416((uint)(this->startTransform).mInv.m[0][2]));
    auVar5 = vfmadd231ps_fma(auVar5,auVar13,auVar10);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(this->startTransform).mInv.m[2];
    auVar3 = vfmadd231ss_fma(auVar3,auVar15,ZEXT416((uint)(this->startTransform).mInv.m[2][2]));
    fVar7 = auVar3._0_4_;
  }
  else if (this->endTime <= time) {
    fVar7 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
    uVar2 = *(undefined8 *)(this->endTransform).mInv.m[1];
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).x;
    auVar14._4_4_ = fVar1;
    auVar14._0_4_ = fVar1;
    auVar14._8_4_ = fVar1;
    auVar14._12_4_ = fVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)(this->endTransform).mInv.m[0];
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    auVar6._0_4_ = fVar7 * (float)uVar2;
    auVar6._4_4_ = fVar7 * (float)((ulong)uVar2 >> 0x20);
    auVar6._8_4_ = fVar7 * 0.0;
    auVar6._12_4_ = fVar7 * 0.0;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->endTransform).mInv.m[1][2])),auVar14,
                             ZEXT416((uint)(this->endTransform).mInv.m[0][2]));
    auVar5 = vfmadd231ps_fma(auVar6,auVar14,auVar11);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(this->endTransform).mInv.m[2];
    auVar3 = vfmadd231ss_fma(auVar3,auVar15,ZEXT416((uint)(this->endTransform).mInv.m[2][2]));
    fVar7 = auVar3._0_4_;
  }
  else {
    Interpolate(&local_90,this,time);
    fVar7 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).x;
    auVar12._4_4_ = fVar1;
    auVar12._0_4_ = fVar1;
    auVar12._8_4_ = fVar1;
    auVar12._12_4_ = fVar1;
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_90.mInv.m[0][0];
    auVar8._4_4_ = local_90.mInv.m[0][1];
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    auVar4._0_4_ = fVar7 * local_90.mInv.m[1][0];
    auVar4._4_4_ = fVar7 * local_90.mInv.m[1][1];
    auVar4._8_4_ = fVar7 * 0.0;
    auVar4._12_4_ = fVar7 * 0.0;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_90.mInv.m[1][2])),auVar12,
                             ZEXT416((uint)local_90.mInv.m[0][2]));
    auVar5 = vfmadd231ps_fma(auVar4,auVar12,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_4_ = local_90.mInv.m[2][0];
    auVar9._4_4_ = local_90.mInv.m[2][1];
    auVar3 = vfmadd231ss_fma(auVar3,auVar15,ZEXT416((uint)local_90.mInv.m[2][2]));
    fVar7 = auVar3._0_4_;
  }
  auVar5 = vfmadd231ps_fma(auVar5,auVar15,auVar9);
  NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar5._0_8_;
  NVar16.super_Tuple3<pbrt::Normal3,_float>.z = fVar7;
  return (Normal3f)NVar16.super_Tuple3<pbrt::Normal3,_float>;
}

Assistant:

Normal3f AnimatedTransform::operator()(const Normal3f &n, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(n);
    else if (time >= endTime)
        return endTransform(n);
    Transform t = Interpolate(time);
    return t(n);
}